

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void resolveAlias(Parse *pParse,ExprList *pEList,int iCol,Expr *pExpr,char *zType,int nSubquery)

{
  byte *pbVar1;
  sqlite3 *db;
  char cVar2;
  undefined2 uVar3;
  u32 uVar4;
  Expr *pEVar5;
  char *pcVar6;
  long lVar7;
  Expr *pEVar8;
  Expr *pEVar9;
  byte bVar10;
  Walker local_68;
  
  bVar10 = 0;
  pEVar5 = pEList->a[iCol].pExpr;
  db = pParse->db;
  if (pEVar5 == (Expr *)0x0) {
    pEVar5 = (Expr *)0x0;
  }
  else {
    pEVar5 = exprDup(db,pEVar5,0,(u8 **)0x0);
  }
  if (pEVar5 != (Expr *)0x0) {
    if ((0 < nSubquery) && (*zType != 'G')) {
      local_68.pParse = (Parse *)0x0;
      local_68.walkerDepth = 0;
      local_68.eCode = '\0';
      local_68._37_3_ = 0;
      local_68.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
      local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
      local_68.xExprCallback = incrAggDepth;
      local_68.u._4_4_ = 0;
      local_68.u.n = nSubquery;
      walkExpr(&local_68,pEVar5);
    }
    if (pExpr->op == '^') {
      pEVar5 = sqlite3ExprAddCollateString(pParse,pEVar5,(pExpr->u).zToken);
    }
    pbVar1 = (byte *)((long)&pEVar5->flags + 2);
    *pbVar1 = *pbVar1 | 0x40;
    pbVar1 = (byte *)((long)&pExpr->flags + 1);
    *pbVar1 = *pbVar1 | 0x80;
    sqlite3ExprDeleteNN(db,pExpr);
    pEVar8 = pEVar5;
    pEVar9 = pExpr;
    for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
      cVar2 = pEVar8->affinity;
      uVar3 = *(undefined2 *)&pEVar8->field_0x2;
      uVar4 = pEVar8->flags;
      pEVar9->op = pEVar8->op;
      pEVar9->affinity = cVar2;
      *(undefined2 *)&pEVar9->field_0x2 = uVar3;
      pEVar9->flags = uVar4;
      pEVar8 = (Expr *)((long)pEVar8 + (ulong)bVar10 * -0x10 + 8);
      pEVar9 = (Expr *)((long)pEVar9 + (ulong)bVar10 * -0x10 + 8);
    }
    if (((pExpr->flags & 0x400) == 0) && ((pExpr->u).zToken != (char *)0x0)) {
      pcVar6 = sqlite3DbStrDup(db,(pExpr->u).zToken);
      (pExpr->u).zToken = pcVar6;
      pbVar1 = (byte *)((long)&pExpr->flags + 2);
      *pbVar1 = *pbVar1 | 1;
    }
    if (pEVar5 != (Expr *)0x0) {
      sqlite3DbFreeNN(db,pEVar5);
    }
  }
  return;
}

Assistant:

static void resolveAlias(
  Parse *pParse,         /* Parsing context */
  ExprList *pEList,      /* A result set */
  int iCol,              /* A column in the result set.  0..pEList->nExpr-1 */
  Expr *pExpr,           /* Transform this into an alias to the result set */
  const char *zType,     /* "GROUP" or "ORDER" or "" */
  int nSubquery          /* Number of subqueries that the label is moving */
){
  Expr *pOrig;           /* The iCol-th column of the result set */
  Expr *pDup;            /* Copy of pOrig */
  sqlite3 *db;           /* The database connection */

  assert( iCol>=0 && iCol<pEList->nExpr );
  pOrig = pEList->a[iCol].pExpr;
  assert( pOrig!=0 );
  db = pParse->db;
  pDup = sqlite3ExprDup(db, pOrig, 0);
  if( pDup==0 ) return;
  if( zType[0]!='G' ) incrAggFunctionDepth(pDup, nSubquery);
  if( pExpr->op==TK_COLLATE ){
    pDup = sqlite3ExprAddCollateString(pParse, pDup, pExpr->u.zToken);
  }
  ExprSetProperty(pDup, EP_Alias);

  /* Before calling sqlite3ExprDelete(), set the EP_Static flag. This 
  ** prevents ExprDelete() from deleting the Expr structure itself,
  ** allowing it to be repopulated by the memcpy() on the following line.
  ** The pExpr->u.zToken might point into memory that will be freed by the
  ** sqlite3DbFree(db, pDup) on the last line of this block, so be sure to
  ** make a copy of the token before doing the sqlite3DbFree().
  */
  ExprSetProperty(pExpr, EP_Static);
  sqlite3ExprDelete(db, pExpr);
  memcpy(pExpr, pDup, sizeof(*pExpr));
  if( !ExprHasProperty(pExpr, EP_IntValue) && pExpr->u.zToken!=0 ){
    assert( (pExpr->flags & (EP_Reduced|EP_TokenOnly))==0 );
    pExpr->u.zToken = sqlite3DbStrDup(db, pExpr->u.zToken);
    pExpr->flags |= EP_MemToken;
  }
  sqlite3DbFree(db, pDup);
}